

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_Plugin_InvalidFeatureExtensionError_Test::
~CommandLineInterfaceTest_Plugin_InvalidFeatureExtensionError_Test
          (CommandLineInterfaceTest_Plugin_InvalidFeatureExtensionError_Test *this)

{
  CommandLineInterfaceTest_Plugin_InvalidFeatureExtensionError_Test *this_local;
  
  ~CommandLineInterfaceTest_Plugin_InvalidFeatureExtensionError_Test(this);
  operator_delete(this,0x2e8);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, Plugin_InvalidFeatureExtensionError) {
  CreateTempFile("foo.proto", R"schema(
    edition = "2023";
    message Foo {
      int32 i = 1;
    }
  )schema");

  SetMockGeneratorTestCase("invalid_features");
  Run("protocol_compiler --proto_path=$tmpdir foo.proto --plug_out=$tmpdir");

  ExpectErrorSubstring(
      "error generating feature defaults: Unknown extension of "
      "google.protobuf.FeatureSet");
}